

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O1

Fl_Tree_Item * __thiscall
Fl_Tree_Item::add(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs,char *new_label,Fl_Tree_Item *item)

{
  Fl_Tree_Sort FVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  if (item == (Fl_Tree_Item *)0x0) {
    item = (Fl_Tree_Item *)operator_new(0x88);
    Fl_Tree_Item(item,prefs);
    label(item,new_label);
  }
  item->_parent = this;
  FVar1 = prefs->_sortorder;
  if (FVar1 != FL_TREE_SORT_NONE) {
    if (FVar1 == FL_TREE_SORT_ASCENDING) {
      iVar5 = (this->_children)._total;
      bVar3 = 0 < iVar5;
      if (0 < iVar5) {
        lVar7 = 0;
        do {
          pcVar2 = (this->_children)._items[lVar7]->_label;
          bVar4 = true;
          if ((pcVar2 != (char *)0x0) && (iVar5 = strcmp(pcVar2,new_label), 0 < iVar5)) {
            Fl_Tree_Item_Array::insert(&this->_children,(int)lVar7,item);
            bVar4 = false;
          }
          if (!bVar4) break;
          lVar7 = lVar7 + 1;
          lVar6 = (long)(this->_children)._total;
          bVar3 = lVar7 < lVar6;
        } while (lVar7 < lVar6);
      }
    }
    else {
      if (FVar1 != FL_TREE_SORT_DESCENDING) {
        return item;
      }
      iVar5 = (this->_children)._total;
      bVar3 = 0 < iVar5;
      if (0 < iVar5) {
        lVar7 = 0;
        do {
          pcVar2 = (this->_children)._items[lVar7]->_label;
          bVar4 = true;
          if ((pcVar2 != (char *)0x0) && (iVar5 = strcmp(pcVar2,new_label), iVar5 < 0)) {
            Fl_Tree_Item_Array::insert(&this->_children,(int)lVar7,item);
            bVar4 = false;
          }
          if (!bVar4) break;
          lVar7 = lVar7 + 1;
          lVar6 = (long)(this->_children)._total;
          bVar3 = lVar7 < lVar6;
        } while (lVar7 < lVar6);
      }
    }
    if (bVar3) {
      return item;
    }
  }
  Fl_Tree_Item_Array::add(&this->_children,item);
  return item;
}

Assistant:

Fl_Tree_Item *Fl_Tree_Item::add(const Fl_Tree_Prefs &prefs,
			        const char *new_label,
				Fl_Tree_Item *item) {
#if FLTK_ABI_VERSION >= 10303
  if ( !item )
    { item = new Fl_Tree_Item(_tree); item->label(new_label); }
#else
  if ( !item )
    { item = new Fl_Tree_Item(prefs); item->label(new_label); }
#endif
  recalc_tree();		// may change tree geometry
  item->_parent = this;
  switch ( prefs.sortorder() ) {
    case FL_TREE_SORT_NONE: {
      _children.add(item);
      return(item);
    }
    case FL_TREE_SORT_ASCENDING: {
      for ( int t=0; t<_children.total(); t++ ) {
        Fl_Tree_Item *c = _children[t];
        if ( c->label() && strcmp(c->label(), new_label) > 0 ) {
          _children.insert(t, item);
          return(item);
        }
      }
      _children.add(item);
      return(item);
    }
    case FL_TREE_SORT_DESCENDING: {
      for ( int t=0; t<_children.total(); t++ ) {
        Fl_Tree_Item *c = _children[t];
        if ( c->label() && strcmp(c->label(), new_label) < 0 ) {
          _children.insert(t, item);
          return(item);
        }
      }
      _children.add(item);
      return(item);
    }
  }
  return(item);
}